

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcCom.c
# Opt level: O0

int Abc_CommandPsInv(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  Wlc_Ntk_t *pNtk_00;
  Wlc_Ntk_t *pWVar2;
  Vec_Int_t *pVVar3;
  char *pcVar4;
  uint local_38;
  int fVerbose;
  int c;
  Wlc_Ntk_t *pNtk;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  pNtk_00 = Wlc_AbcGetNtk(pAbc);
  local_38 = 0;
  Extra_UtilGetoptReset();
  while( true ) {
    iVar1 = Extra_UtilGetopt(argc,argv,"vh");
    if (iVar1 == -1) {
      if (pNtk_00 == (Wlc_Ntk_t *)0x0) {
        Abc_Print(1,"Abc_CommandPsInv(): There is no current design.\n");
      }
      else {
        pWVar2 = Wlc_AbcGetNtk(pAbc);
        if (pWVar2 == (Wlc_Ntk_t *)0x0) {
          Abc_Print(1,"Abc_CommandPsInv(): There is no saved invariant.\n");
        }
        else {
          pVVar3 = Wlc_AbcGetInv(pAbc);
          if (pVVar3 == (Vec_Int_t *)0x0) {
            Abc_Print(1,"Abc_CommandPsInv(): Invariant is not available.\n");
          }
          else {
            pVVar3 = Wlc_AbcGetInv(pAbc);
            Wlc_NtkPrintInvStats(pNtk_00,pVVar3,local_38);
          }
        }
      }
      return 0;
    }
    if ((iVar1 == 0x68) || (iVar1 != 0x76)) break;
    local_38 = local_38 ^ 1;
  }
  Abc_Print(-2,"usage: %%psinv [-vh]\n");
  Abc_Print(-2,"\t         prints statistics for inductive invariant\n");
  Abc_Print(-2,"\t         (in the case of \'sat\' or \'undecided\', inifity clauses are used)\n");
  pcVar4 = "no";
  if (local_38 != 0) {
    pcVar4 = "yes";
  }
  Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar4);
  Abc_Print(-2,"\t-h     : print the command usage\n");
  return 1;
}

Assistant:

int Abc_CommandPsInv( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern void Wlc_NtkPrintInvStats( Wlc_Ntk_t * pNtk, Vec_Int_t * vInv, int fVerbose );
    Wlc_Ntk_t * pNtk = Wlc_AbcGetNtk(pAbc);
    int c, fVerbose  = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "vh" ) ) != EOF )
    {
        switch ( c )
        {
            case 'v':
                fVerbose ^= 1;
                break;
            case 'h':
                goto usage;
            default:
                goto usage;
        }
    }
    if ( pNtk == NULL )
    {
        Abc_Print( 1, "Abc_CommandPsInv(): There is no current design.\n" );
        return 0;
    }
    if ( Wlc_AbcGetNtk(pAbc) == NULL )
    {
        Abc_Print( 1, "Abc_CommandPsInv(): There is no saved invariant.\n" );
        return 0;
    }
    if ( Wlc_AbcGetInv(pAbc) == NULL )
    {
        Abc_Print( 1, "Abc_CommandPsInv(): Invariant is not available.\n" );
        return 0;
    }
    Wlc_NtkPrintInvStats( pNtk, Wlc_AbcGetInv(pAbc), fVerbose );
    return 0;
    usage:
    Abc_Print( -2, "usage: %%psinv [-vh]\n" );
    Abc_Print( -2, "\t         prints statistics for inductive invariant\n" );
    Abc_Print( -2, "\t         (in the case of \'sat\' or \'undecided\', inifity clauses are used)\n" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}